

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_base_boundary_constructors<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>>
               (void)

{
  uint uVar1;
  pointer ppEVar2;
  void *pvVar3;
  undefined8 *puVar4;
  pointer ppVar5;
  bool bVar6;
  undefined4 *puVar7;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  *pEVar8;
  uint uVar9;
  pair<unsigned_int,_unsigned_int> *p;
  pointer ppVar10;
  pointer ppEVar11;
  undefined8 *puVar12;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range4;
  ulong uVar13;
  pair<unsigned_int,_unsigned_int> *p_1;
  Container cont2;
  value_type local_248;
  undefined1 local_240;
  undefined8 *local_238;
  undefined ***local_230;
  Container cont1;
  long local_210;
  __node_base local_208;
  long *local_200;
  undefined **local_1f8;
  ulong local_1f0;
  shared_count sStack_1e8;
  __node_base *local_1e0;
  undefined1 local_1d4 [4];
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  rowCol;
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  col;
  Column_settings settings;
  undefined **local_e8;
  char *local_e0;
  shared_count sStack_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  shared_count sStack_b8;
  __node_base *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            (&settings.operators,5);
  cont1.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cont1.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cont1.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cont2.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cont2.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cont2.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 1;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 2;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 2;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000004;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&cont1,&col);
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 1;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 5;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 2;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_300000006;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&cont2,&col);
  rowCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ::vector(&col.column_,
           (long)cont1.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)cont1.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&rowCol,
           (allocator_type *)&local_248);
  ppVar5 = cont1.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  col.erasedValues_._M_h._M_buckets = &col.erasedValues_._M_h._M_single_bucket;
  col.erasedValues_._M_h._M_bucket_count = 1;
  col.erasedValues_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  col.erasedValues_._M_h._M_element_count = 0;
  col.erasedValues_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  col.entryPool_ = (Entry_constructor *)&settings.field_0x20;
  col.erasedValues_._M_h._M_rehash_policy._M_next_resize = 0;
  col.erasedValues_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  col.operators_ = &settings.operators;
  if (cont1.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      cont1.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar13 = 0;
    ppVar10 = cont1.
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar9 = ppVar10->second;
      if ((col.operators_)->characteristic_ <= uVar9) {
        uVar9 = uVar9 % (col.operators_)->characteristic_;
      }
      uVar1 = ppVar10->first;
      puVar7 = (undefined4 *)operator_new(8);
      *puVar7 = 0;
      puVar7[1] = uVar1;
      *(undefined4 **)
       (CONCAT44(col.column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                 col.column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar13 * 8) = puVar7;
      **(uint **)(CONCAT44(col.column_.
                           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           col.column_.
                           super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar13 * 8) = uVar9;
      uVar13 = (ulong)((int)uVar13 + 1);
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != ppVar5);
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x261);
  local_1f0 = local_1f0 & 0xffffffffffffff00;
  local_1f8 = &PTR__lazy_ostream_001a57f0;
  sStack_1e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e0 = (__node_base *)0x182247;
  local_208._M_nxt =
       (_Hash_node_base *)
       ((CONCAT44(col.column_.
                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                  col.column_.
                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
         CONCAT44(col.column_.
                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                  col.column_.
                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 3) -
       col.erasedValues_._M_h._M_element_count);
  local_b0 = &local_208;
  local_200 = &local_210;
  local_e8 = (undefined **)CONCAT71(local_e8._1_7_,local_208._M_nxt == (_Hash_node_base *)0x3);
  local_210 = CONCAT44(local_210._4_4_,3);
  local_e0 = (char *)0x0;
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c0 = "";
  rowCol.erasedValues_._M_h._M_buckets = &local_b0;
  rowCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  rowCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_001a5738;
  rowCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_230 = (undefined ***)&local_200;
  local_240 = 0;
  local_248 = (value_type)&PTR__lazy_ostream_001a57b0;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_248 = (value_type)0x0;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
  ::vector(&rowCol.column_,
           (long)cont2.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)cont2.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,&local_248,
           (allocator_type *)&local_1f8);
  ppVar5 = cont2.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  rowCol.erasedValues_._M_h._M_buckets = &rowCol.erasedValues_._M_h._M_single_bucket;
  rowCol.erasedValues_._M_h._M_bucket_count = 1;
  rowCol.erasedValues_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  rowCol.erasedValues_._M_h._M_element_count = 0;
  rowCol.erasedValues_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  rowCol.erasedValues_._M_h._M_rehash_policy._M_next_resize = 0;
  rowCol.erasedValues_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  rowCol.entryPool_ = (Entry_constructor *)&settings.field_0x20;
  rowCol.operators_ = &settings.operators;
  if (cont2.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      cont2.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar13 = 0;
    ppVar10 = cont2.
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar9 = ppVar10->second;
      if ((rowCol.operators_)->characteristic_ <= uVar9) {
        uVar9 = uVar9 % (rowCol.operators_)->characteristic_;
      }
      uVar1 = ppVar10->first;
      pEVar8 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                *)operator_new(8);
      (pEVar8->super_Entry_field_element_option).element_ = 0;
      pEVar8->rowIndex_ = uVar1;
      rowCol.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar13] = pEVar8;
      (rowCol.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar13]->super_Entry_field_element_option).element_
           = uVar9;
      uVar13 = (ulong)((int)uVar13 + 1);
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != ppVar5);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x265);
  local_e0 = (char *)((ulong)local_e0 & 0xffffffffffffff00);
  local_e8 = &PTR__lazy_ostream_001a57f0;
  sStack_d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_210 = (CONCAT71(rowCol.column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                        rowCol.column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_1_) -
               (long)rowCol.column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) -
              rowCol.erasedValues_._M_h._M_element_count;
  local_d0 = "";
  local_208._M_nxt = (_Hash_node_base *)local_1d4;
  local_c8 = (char *)CONCAT71(local_c8._1_7_,local_210 == 3);
  local_1d4 = (undefined1  [4])0x3;
  local_c0 = (char *)0x0;
  sStack_b8.pi_ = (sp_counted_base *)0x0;
  local_b0 = (__node_base *)0x1822c9;
  local_a8 = "";
  local_200 = &local_210;
  local_240 = 0;
  local_248 = (value_type)&PTR__lazy_ostream_001a5738;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_230 = (undefined ***)&local_200;
  local_1f0 = local_1f0 & 0xffffffffffffff00;
  local_1f8 = &PTR__lazy_ostream_001a57b0;
  sStack_1e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_208;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_e8,&local_b0,0x265,1,2,2,"rowCol.size()",&local_248,"3",&local_1f8);
  boost::detail::shared_count::~shared_count(&sStack_b8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x267);
  bVar6 = Gudhi::persistence_matrix::operator==(&col,&rowCol);
  local_1f8 = (undefined **)CONCAT71(local_1f8._1_7_,!bVar6);
  local_1f0 = 0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_e8 = (undefined **)0x182b17;
  local_e0 = "";
  local_240 = 0;
  local_248 = (value_type)&PTR__lazy_ostream_001a5830;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_230 = &local_e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  ppEVar2 = (pointer)CONCAT71(rowCol.column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                              rowCol.column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  for (ppEVar11 = rowCol.column_.
                  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppEVar11 != ppEVar2;
      ppEVar11 = ppEVar11 + 1) {
    if (*ppEVar11 !=
        (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
         *)0x0) {
      operator_delete(*ppEVar11,8);
    }
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&rowCol.erasedValues_._M_h);
  if (rowCol.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(rowCol.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)rowCol.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)rowCol.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  puVar4 = (undefined8 *)
           CONCAT44(col.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                    col.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_4_);
  for (puVar12 = (undefined8 *)
                 CONCAT44(col.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          col.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_4_); puVar12 != puVar4;
      puVar12 = puVar12 + 1) {
    if ((void *)*puVar12 != (void *)0x0) {
      operator_delete((void *)*puVar12,8);
    }
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&col.erasedValues_._M_h);
  pvVar3 = (void *)CONCAT44(col.column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            col.column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)col.column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  if (cont2.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cont2.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cont2.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cont2.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (cont1.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cont1.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cont1.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cont1.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (settings.operators.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(settings.operators.inverse_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)settings.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)settings.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

std::vector<Column> build_base_boundary_column_matrix(Rows& rows, typename Column::Column_settings& settings) {
  std::vector<Column> matrix;

  if constexpr (is_z2<Column>()) {
    using cont = std::vector<unsigned int>;
    matrix.emplace_back(0, cont{0, 1, 3, 5}, &rows, &settings);
    matrix.emplace_back(1, cont{0, 1, 2, 5, 6}, &rows, &settings);
    matrix.emplace_back(2, cont{0, 1, 2, 5, 6}, &rows, &settings);
    matrix.emplace_back(3, cont{}, &rows, &settings);
    matrix.emplace_back(4, cont{0, 1, 3, 5}, &rows, &settings);
    matrix.emplace_back(matrix[1], 5, &rows);
  } else {
    using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;
    matrix.emplace_back(0, cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, &rows, &settings);
    matrix.emplace_back(1, cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &rows, &settings);
    matrix.emplace_back(2, cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &rows, &settings);
    matrix.emplace_back(3, cont{}, &rows, &settings);
    matrix.emplace_back(4, cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, &rows, &settings);
    matrix.emplace_back(matrix[1], 5, &rows);
  }

  return matrix;
}